

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_chunks<std::vector<xray_re::sound_src_data*,std::allocator<xray_re::sound_src_data*>>,write_sound_src>
          (xr_writer *this,
          vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_> *container)

{
  bool bVar1;
  reference ppsVar2;
  uint32_t local_34;
  const_iterator cStack_30;
  uint32_t id;
  const_iterator end;
  const_iterator it;
  vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>::begin
                  (container);
  cStack_30 = std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>::
              end(container);
  local_34 = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    open_chunk(this,local_34);
    ppsVar2 = __gnu_cxx::
              __normal_iterator<xray_re::sound_src_data_*const_*,_std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>_>
              ::operator*(&end);
    write_sound_src::operator()((write_sound_src *)((long)&this_local + 7),*ppsVar2,this);
    close_chunk(this);
    __gnu_cxx::
    __normal_iterator<xray_re::sound_src_data_*const_*,_std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>_>
    ::operator++(&end);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

inline void xr_writer::w_chunks(const T& container, F write)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_chunk(id++);
		write(*it, *this);
		close_chunk();
	}
}